

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>::templated_iterator<slang::ConstantValue>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::ConstantValue,slang::ConstantValue,slang::Hasher<slang::ConstantValue>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ConstantValue>>,std::allocator<slang::ConstantValue>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>>>
::emplace_new_key<slang::ConstantValue&>
          (sherwood_v3_table<slang::ConstantValue,slang::ConstantValue,slang::Hasher<slang::ConstantValue>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ConstantValue>>,std::allocator<slang::ConstantValue>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,ConstantValue *key)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pair<ska::detailv3::sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>::templated_iterator<slang::ConstantValue>,_bool>
  pVar6;
  pair<ska::detailv3::sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>::templated_iterator<slang::ConstantValue>,_bool>
  pVar7;
  bool local_95 [13];
  templated_iterator<slang::ConstantValue> local_88;
  iterator result;
  value_type to_insert;
  templated_iterator<slang::ConstantValue> local_50 [3];
  ConstantValue *local_38;
  ConstantValue *key_local;
  EntryPointer current_entry_local;
  sherwood_v3_table<slang::ConstantValue,slang::ConstantValue,slang::Hasher<slang::ConstantValue>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ConstantValue>>,std::allocator<slang::ConstantValue>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>>>
  *psStack_20;
  int8_t distance_from_desired_local;
  sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
  *this_local;
  bool local_10;
  
  local_38 = key;
  key_local = (ConstantValue *)current_entry;
  current_entry_local._7_1_ =
       (sherwood_v3_table<slang::ConstantValue,slang::ConstantValue,slang::Hasher<slang::ConstantValue>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ConstantValue>>,std::allocator<slang::ConstantValue>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>>>
        )distance_from_desired;
  psStack_20 = this;
  if ((*(long *)(this + 8) != 0) &&
     ((sherwood_v3_table<slang::ConstantValue,slang::ConstantValue,slang::Hasher<slang::ConstantValue>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ConstantValue>>,std::allocator<slang::ConstantValue>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>>>
       )distance_from_desired != this[0x11])) {
    lVar3 = *(long *)(this + 0x18) + 1;
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    lVar2 = *(long *)(this + 8) + 1;
    auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5._0_8_ = lVar2;
    auVar5._12_4_ = 0x45300000;
    if ((auVar4._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) <=
        ((auVar5._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) *
        (double)*(float *)(this + 0x14)) {
      bVar1 = sherwood_v3_entry<slang::ConstantValue>::is_empty(current_entry);
      if (bVar1) {
        sherwood_v3_entry<slang::ConstantValue>::emplace<slang::ConstantValue&>
                  ((sherwood_v3_entry<slang::ConstantValue> *)key_local,
                   (int8_t)current_entry_local._7_1_,local_38);
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
        ::templated_iterator<slang::ConstantValue>::templated_iterator
                  (local_50,(EntryPointer)key_local);
        to_insert.value.
        super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ._39_1_ = 1;
        std::
        pair<ska::detailv3::sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>::templated_iterator<slang::ConstantValue>,_bool>
        ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>::templated_iterator<slang::ConstantValue>,_bool>
                            *)&this_local,local_50,
                           (bool *)((long)&to_insert.value.
                                           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                           .
                                           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                           .
                                           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                           .
                                           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                           .
                                           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   + 0x27));
        pVar6._8_8_ = extraout_RDX;
        pVar6.first.current = (EntryPointer)this_local;
      }
      else {
        slang::ConstantValue::ConstantValue((ConstantValue *)&result,local_38);
        std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
        std::swap<slang::ConstantValue>
                  ((ConstantValue *)&result,
                   (ConstantValue *)
                   ((long)&(key_local->value).
                           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   + 8));
        sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
        ::templated_iterator<slang::ConstantValue>::templated_iterator
                  (&local_88,(EntryPointer)key_local);
        current_entry_local._7_1_ =
             (sherwood_v3_table<slang::ConstantValue,slang::ConstantValue,slang::Hasher<slang::ConstantValue>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ConstantValue>>,std::allocator<slang::ConstantValue>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>>>
              )((char)current_entry_local._7_1_ + '\x01');
        do {
          while( true ) {
            key_local = (ConstantValue *)
                        ((long)&key_local[1].value.
                                super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        + 8);
            bVar1 = sherwood_v3_entry<slang::ConstantValue>::is_empty
                              ((sherwood_v3_entry<slang::ConstantValue> *)key_local);
            if (bVar1) {
              sherwood_v3_entry<slang::ConstantValue>::emplace<slang::ConstantValue>
                        ((sherwood_v3_entry<slang::ConstantValue> *)key_local,
                         (int8_t)current_entry_local._7_1_,(ConstantValue *)&result);
              *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
              local_95[0] = true;
              std::
              pair<ska::detailv3::sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>::templated_iterator<slang::ConstantValue>,_bool>
              ::
              pair<ska::detailv3::sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>::templated_iterator<slang::ConstantValue>_&,_bool,_true>
                        ((pair<ska::detailv3::sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>::templated_iterator<slang::ConstantValue>,_bool>
                          *)&this_local,&local_88,local_95);
              goto LAB_005d0677;
            }
            if ((char)current_entry_local._7_1_ <=
                *(char *)&(key_local->value).
                          super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               ) break;
            std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
            std::swap<slang::ConstantValue>
                      ((ConstantValue *)&result,
                       (ConstantValue *)
                       ((long)&(key_local->value).
                               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       + 8));
            current_entry_local._7_1_ =
                 (sherwood_v3_table<slang::ConstantValue,slang::ConstantValue,slang::Hasher<slang::ConstantValue>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ConstantValue>>,std::allocator<slang::ConstantValue>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>>>
                  )((char)current_entry_local._7_1_ + '\x01');
          }
          current_entry_local._7_1_ =
               (sherwood_v3_table<slang::ConstantValue,slang::ConstantValue,slang::Hasher<slang::ConstantValue>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ConstantValue>>,std::allocator<slang::ConstantValue>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>>>
                )((char)current_entry_local._7_1_ + '\x01');
        } while (current_entry_local._7_1_ != this[0x11]);
        std::swap<slang::ConstantValue>
                  ((ConstantValue *)&result,&((local_88.current)->field_1).value);
        sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
        ::grow((sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
                *)this);
        pVar6 = sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
                ::emplace<slang::ConstantValue>
                          ((sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
                            *)this,(ConstantValue *)&result);
        this_local = (sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
                      *)pVar6.first.current;
        local_10 = pVar6.second;
LAB_005d0677:
        slang::ConstantValue::~ConstantValue((ConstantValue *)&result);
        pVar6._8_8_ = extraout_RDX_00;
        pVar6.first.current = (EntryPointer)this_local;
      }
      goto LAB_005d0680;
    }
  }
  sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
  ::grow((sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
          *)this);
  pVar6 = emplace<slang::ConstantValue&>(this,local_38);
  local_10 = pVar6.second;
LAB_005d0680:
  this_local = (sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
                *)pVar6.first.current;
  pVar7._9_7_ = pVar6._9_7_;
  pVar7.second = local_10;
  pVar7.first.current = (EntryPointer)this_local;
  return pVar7;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }